

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitSequencingExpression(SyntaxDumper *this,SequencingExpressionSyntax *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SyntaxToken local_50;
  SequencingExpressionSyntax *local_18;
  SequencingExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (SequencingExpressionSyntax *)this;
  iVar1 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xd9])();
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,CONCAT44(extraout_var,iVar1));
  (*(local_18->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xda])();
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  iVar1 = (*(local_18->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xdb])()
  ;
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,CONCAT44(extraout_var_00,iVar1));
  return Skip;
}

Assistant:

virtual Action visitSequencingExpression(const SequencingExpressionSyntax* node) override
    {
        nonterminal(node->left());
        terminal(node->operatorToken(), node);
        nonterminal(node->right());
        return Action::Skip;
    }